

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-bookmarks.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  char cVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  long lVar5;
  QPDF qpdf;
  vector<int,_std::allocator<int>_> numbers;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_68 [24];
  QPDFOutlineDocumentHelper odh;
  
  pcVar3 = (char *)QUtil::getWhoami(*argv);
  whoami = pcVar3;
  if (argc == 2) {
    iVar2 = strcmp(argv[1],"--version");
    if (iVar2 == 0) goto LAB_00103c4d;
  }
  pcVar3 = "--numbers";
  for (lVar5 = 1; lVar5 < argc; lVar5 = lVar5 + 1) {
    __s1 = argv[lVar5];
    if (*__s1 != '-') {
      iVar2 = (int)lVar5 + 1;
      if (iVar2 < argc) {
        iVar2 = (int)lVar5 + 2;
        pcVar3 = argv[lVar5 + 1];
      }
      else {
        pcVar3 = "";
      }
      if (iVar2 == argc) {
        pcVar3 = argv[lVar5];
        QPDF::QPDF(&qpdf);
        QPDF::processFile((char *)&qpdf,pcVar3);
        QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper(&odh,&qpdf);
        cVar1 = QPDFOutlineDocumentHelper::hasOutlines();
        if (cVar1 == '\0') {
          poVar4 = std::operator<<((ostream *)&std::cout,pcVar3);
          poVar4 = std::operator<<(poVar4," has no bookmarks");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        else {
          numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          if (show_targets == '\x01') {
            generate_page_map(&qpdf);
          }
          QPDFOutlineDocumentHelper::getTopLevelOutlines();
          extract_bookmarks(local_68,&numbers);
          std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
                    (local_68);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&numbers.super__Vector_base<int,_std::allocator<int>_>);
        }
        QPDFOutlineDocumentHelper::~QPDFOutlineDocumentHelper(&odh);
        QPDF::~QPDF(&qpdf);
        return 0;
      }
      break;
    }
    iVar2 = strcmp(__s1,"--numbers");
    if (iVar2 == 0) {
      style = st_numbers;
    }
    else {
      iVar2 = strcmp(__s1,"--lines");
      if (iVar2 == 0) {
        style = st_lines;
      }
      else {
        iVar2 = strcmp(__s1,"--show-open");
        if (iVar2 == 0) {
          show_open = 1;
        }
        else {
          iVar2 = strcmp(__s1,"--show-targets");
          if (iVar2 != 0) break;
          show_targets = '\x01';
        }
      }
    }
  }
  usage();
LAB_00103c4d:
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar3);
  poVar4 = std::operator<<(poVar4," version 1.5");
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(0);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if ((argc == 2) && (strcmp(argv[1], "--version") == 0)) {
        std::cout << whoami << " version 1.5" << std::endl;
        exit(0);
    }

    int arg;
    for (arg = 1; arg < argc; ++arg) {
        if (argv[arg][0] == '-') {
            if (strcmp(argv[arg], "--numbers") == 0) {
                style = st_numbers;
            } else if (strcmp(argv[arg], "--lines") == 0) {
                style = st_lines;
            } else if (strcmp(argv[arg], "--show-open") == 0) {
                show_open = true;
            } else if (strcmp(argv[arg], "--show-targets") == 0) {
                show_targets = true;
            } else {
                usage();
            }
        } else {
            break;
        }
    }

    if (arg >= argc) {
        usage();
    }

    char const* filename = argv[arg++];
    char const* password = "";

    if (arg < argc) {
        password = argv[arg++];
    }
    if (arg != argc) {
        usage();
    }

    try {
        QPDF qpdf;
        qpdf.processFile(filename, password);

        QPDFOutlineDocumentHelper odh(qpdf);
        if (odh.hasOutlines()) {
            std::vector<int> numbers;
            if (show_targets) {
                generate_page_map(qpdf);
            }
            extract_bookmarks(odh.getTopLevelOutlines(), numbers);
        } else {
            std::cout << filename << " has no bookmarks" << std::endl;
        }
    } catch (std::exception& e) {
        std::cerr << whoami << " processing file " << filename << ": " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}